

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

SNMP_ERROR_RESPONSE __thiscall SNMPAgent::loop(SNMPAgent *this)

{
  UDP *this_00;
  bool bVar1;
  int iVar2;
  reference ppUVar3;
  ssize_t sVar4;
  size_t in_RCX;
  size_t __n;
  IPAddress local_58;
  SNMP_ERROR_RESPONSE local_48;
  int local_44;
  SNMP_ERROR_RESPONSE response;
  int responseLength;
  int readBytes;
  int packetLength;
  UDP *udp;
  iterator __end1;
  iterator __begin1;
  list<UDP_*,_std::allocator<UDP_*>_> *__range1;
  SNMPAgent *this_local;
  
  __end1 = std::__cxx11::list<UDP_*,_std::allocator<UDP_*>_>::begin
                     ((list<UDP_*,_std::allocator<UDP_*>_> *)(this + 0x98));
  udp = (UDP *)std::__cxx11::list<UDP_*,_std::allocator<UDP_*>_>::end
                         ((list<UDP_*,_std::allocator<UDP_*>_> *)(this + 0x98));
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&udp);
    if (!bVar1) {
      handleInformQueue(this);
      return SNMP_NO_PACKET;
    }
    ppUVar3 = std::_List_iterator<UDP_*>::operator*(&__end1);
    _readBytes = *ppUVar3;
    responseLength = UDP::parsePacket(_readBytes);
    if (0 < responseLength) break;
    std::_List_iterator<UDP_*>::operator++(&__end1);
  }
  if ((-1 < responseLength) && (responseLength < 0x579)) {
    memset(this + 0xd0,0,0x578);
    sVar4 = UDP::read(_readBytes,(int)this + 0xd0,(void *)(ulong)(uint)responseLength,in_RCX);
    response = (SNMP_ERROR_RESPONSE)sVar4;
    if (response != responseLength) {
      return SNMP_REQUEST_INVALID;
    }
    local_44 = 0;
    __n = 0x578;
    local_48 = handlePacket((uint8_t *)(this + 0xd0),responseLength,&local_44,0x578,
                            (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)
                            (this + 0x48),(string *)this,(string *)(this + 0x20),informCallback,this
                           );
    this_00 = _readBytes;
    if ((SNMP_NO_PACKET < local_48) && (local_48 != SNMP_INFORM_RESPONSE_OCCURRED)) {
      UDP::remoteIP((UDP *)&local_58);
      iVar2 = UDP::remotePort(_readBytes);
      UDP::beginPacket(this_00,&local_58,(uint16_t)iVar2);
      IPAddress::~IPAddress(&local_58);
      UDP::write(_readBytes,(int)this + 0xd0,(void *)(long)local_44,__n);
      UDP::endPacket(_readBytes);
    }
    if (local_48 == SNMP_SET_OCCURRED) {
      this[0x42] = (SNMPAgent)0x1;
    }
    handleInformQueue(this);
    return local_48;
  }
  return SNMP_REQUEST_TOO_LARGE;
}

Assistant:

SNMP_ERROR_RESPONSE SNMPAgent::loop(){
    for(auto udp : _udp){
        int packetLength = udp->parsePacket();
        if(packetLength > 0){
            SNMP_LOGD("Received packet from: %s, of size: %d", udp->remoteIP().toString().c_str(), packetLength);

            if(packetLength < 0 || packetLength > MAX_SNMP_PACKET_LENGTH){
                SNMP_LOGW("Incoming packet too large: %d\n", packetLength);
                return SNMP_REQUEST_TOO_LARGE;
            }

            memset(_packetBuffer, 0, MAX_SNMP_PACKET_LENGTH);

            int readBytes = udp->read(_packetBuffer, packetLength);
            if(readBytes != packetLength){
                SNMP_LOGW("Packet length mismatch: expected: %d, actual: %d\n", packetLength, readBytes);
                return SNMP_REQUEST_INVALID;
            }

            int responseLength = 0;
            SNMP_ERROR_RESPONSE response = handlePacket(_packetBuffer, packetLength, &responseLength, MAX_SNMP_PACKET_LENGTH, callbacks, _community, _readOnlyCommunity, informCallback, (void*)this);
            if(response > 0 && response != SNMP_INFORM_RESPONSE_OCCURRED){
                // send it
                SNMP_LOGD("Built packet, sending back response to: %s, %d\n", udp->remoteIP().toString().c_str(), udp->remotePort());
                udp->beginPacket(udp->remoteIP(), udp->remotePort());
                udp->write(_packetBuffer, responseLength);

                if(!udp->endPacket()){
                    SNMP_LOGW("Failed to send response packet\n");
                }
            }

            if(response == SNMP_SET_OCCURRED){
                setOccurred = true;
            }

            this->handleInformQueue();
            return response;
        }
    }
    
    this->handleInformQueue();
    return SNMP_NO_PACKET;
}